

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

bool woff2::TransformGlyfAndLocaTables(Font *font)

{
  uint8_t uVar1;
  bool bVar2;
  bool bVar3;
  mapped_type *pmVar4;
  Table *pTVar5;
  reference pvVar6;
  size_type sVar7;
  uchar *puVar8;
  Table *head_table;
  size_t local_178;
  size_t glyph_size;
  uint8_t *glyph_data;
  undefined1 local_158 [8];
  Glyph glyph;
  undefined1 local_110 [4];
  int i;
  GlyfEncoder encoder;
  int num_glyphs;
  Table *transformed_loca;
  mapped_type *local_30;
  Table *transformed_glyf;
  Table *loca_table;
  Table *glyf_table;
  Font *font_local;
  
  glyf_table = (Table *)font;
  loca_table = Font::FindTable(font,0x676c7966);
  transformed_glyf = Font::FindTable((Font *)glyf_table,0x6c6f6361);
  if ((transformed_glyf == (Table *)0x0) && (loca_table == (Table *)0x0)) {
    font_local._7_1_ = 1;
  }
  else if ((loca_table == (Table *)0x0) == (transformed_glyf == (Table *)0x0)) {
    bVar2 = Font::Table::IsReused(transformed_glyf);
    bVar3 = Font::Table::IsReused(loca_table);
    if (bVar2 == bVar3) {
      bVar2 = Font::Table::IsReused(transformed_glyf);
      if (bVar2) {
        font_local._7_1_ = 1;
      }
      else {
        transformed_loca._4_4_ = 0xe7ecf9e6;
        local_30 = std::
                   map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                   ::operator[]((map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                                 *)&glyf_table->offset,(key_type *)((long)&transformed_loca + 4));
        encoder._196_4_ = 0xecefe3e1;
        pmVar4 = std::
                 map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                 ::operator[]((map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                               *)&glyf_table->offset,(key_type *)&encoder.field_0xc4);
        encoder.n_glyphs_ = NumGlyphs((Font *)glyf_table);
        anon_unknown_2::GlyfEncoder::GlyfEncoder((GlyfEncoder *)local_110,encoder.n_glyphs_);
        glyph.have_instructions = false;
        glyph._61_3_ = 0;
        for (; (int)glyph._60_4_ < encoder.n_glyphs_; glyph._60_4_ = glyph._60_4_ + 1) {
          Glyph::Glyph((Glyph *)local_158);
          bVar2 = GetGlyphData((Font *)glyf_table,glyph._60_4_,(uint8_t **)&glyph_size,&local_178);
          if ((bVar2) &&
             ((local_178 == 0 ||
              (bVar2 = ReadGlyph((uint8_t *)glyph_size,local_178,(Glyph *)local_158), bVar2)))) {
            anon_unknown_2::GlyfEncoder::Encode
                      ((GlyfEncoder *)local_110,glyph._60_4_,(Glyph *)local_158);
            bVar2 = false;
          }
          else {
            font_local._7_1_ = 0;
            bVar2 = true;
          }
          Glyph::~Glyph((Glyph *)local_158);
          if (bVar2) goto LAB_00133cc0;
        }
        anon_unknown_2::GlyfEncoder::GetTransformedGlyfBytes
                  ((GlyfEncoder *)local_110,&local_30->buffer);
        pTVar5 = Font::FindTable((Font *)glyf_table,0x68656164);
        if ((pTVar5 == (Table *)0x0) || (pTVar5->length < 0x34)) {
          font_local._7_1_ = 0;
        }
        else {
          uVar1 = pTVar5->data[0x33];
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&local_30->buffer,7);
          *pvVar6 = uVar1;
          local_30->tag = 0xe7ecf9e6;
          sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            (&local_30->buffer);
          local_30->length = (uint32_t)sVar7;
          puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             (&local_30->buffer);
          local_30->data = puVar8;
          pmVar4->tag = 0xecefe3e1;
          pmVar4->length = 0;
          pmVar4->data = (uint8_t *)0x0;
          font_local._7_1_ = 1;
        }
LAB_00133cc0:
        anon_unknown_2::GlyfEncoder::~GlyfEncoder((GlyfEncoder *)local_110);
      }
    }
    else {
      font_local._7_1_ = 0;
    }
  }
  else {
    font_local._7_1_ = 0;
  }
  return (bool)(font_local._7_1_ & 1);
}

Assistant:

bool TransformGlyfAndLocaTables(Font* font) {
  // no transform for CFF
  const Font::Table* glyf_table = font->FindTable(kGlyfTableTag);
  const Font::Table* loca_table = font->FindTable(kLocaTableTag);

  // If you don't have glyf/loca this transform isn't very interesting
  if (loca_table == NULL && glyf_table == NULL) {
    return true;
  }
  // It would be best if you didn't have just one of glyf/loca
  if ((glyf_table == NULL) != (loca_table == NULL)) {
    return FONT_COMPRESSION_FAILURE();
  }
  // Must share neither or both loca & glyf
  if (loca_table->IsReused() != glyf_table->IsReused()) {
    return FONT_COMPRESSION_FAILURE();
  }
  if (loca_table->IsReused()) {
    return true;
  }

  Font::Table* transformed_glyf = &font->tables[kGlyfTableTag ^ 0x80808080];
  Font::Table* transformed_loca = &font->tables[kLocaTableTag ^ 0x80808080];

  int num_glyphs = NumGlyphs(*font);
  GlyfEncoder encoder(num_glyphs);
  for (int i = 0; i < num_glyphs; ++i) {
    Glyph glyph;
    const uint8_t* glyph_data;
    size_t glyph_size;
    if (!GetGlyphData(*font, i, &glyph_data, &glyph_size) ||
        (glyph_size > 0 && !ReadGlyph(glyph_data, glyph_size, &glyph))) {
      return FONT_COMPRESSION_FAILURE();
    }
    encoder.Encode(i, glyph);
  }
  encoder.GetTransformedGlyfBytes(&transformed_glyf->buffer);

  const Font::Table* head_table = font->FindTable(kHeadTableTag);
  if (head_table == NULL || head_table->length < 52) {
    return FONT_COMPRESSION_FAILURE();
  }
  transformed_glyf->buffer[7] = head_table->data[51];  // index_format

  transformed_glyf->tag = kGlyfTableTag ^ 0x80808080;
  transformed_glyf->length = transformed_glyf->buffer.size();
  transformed_glyf->data = transformed_glyf->buffer.data();

  transformed_loca->tag = kLocaTableTag ^ 0x80808080;
  transformed_loca->length = 0;
  transformed_loca->data = NULL;

  return true;
}